

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O0

void __thiscall
OpenMD::SectionParserManager::parse(SectionParserManager *this,istream *input,ForceField *ff)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  pointer pSVar8;
  undefined8 in_RDX;
  long *in_RSI;
  streampos sVar9;
  string section_1;
  string section;
  string keyword;
  StringTokenizer tokenizer;
  string line;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sectionNameStack;
  int lineNo;
  char buffer [65535];
  int bufferSize;
  iterator i;
  value_type *in_stack_fffffffffffefca8;
  StringTokenizer *in_stack_fffffffffffefcb0;
  StringTokenizer *in_stack_fffffffffffefcc0;
  string *in_stack_fffffffffffefcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffefcd0;
  string *in_stack_fffffffffffefcd8;
  errorStruct *peVar10;
  undefined7 in_stack_fffffffffffefce0;
  undefined1 in_stack_fffffffffffefce7;
  string *in_stack_fffffffffffefce8;
  errorStruct *in_stack_fffffffffffefcf0;
  undefined4 in_stack_fffffffffffefd18;
  uint in_stack_fffffffffffefd1c;
  __mbstate_t in_stack_fffffffffffefd20;
  streamoff in_stack_fffffffffffefd28;
  StringTokenizer *this_00;
  _Self _Stack_10258;
  _List_node_base *p_Stack_10250;
  string asStack_10248 [32];
  streampos sStack_10228;
  _Self a_Stack_10218 [5];
  _List_node_base *p_Stack_101f0;
  _List_node_base *p_Stack_101e8;
  _List_node_base *p_Stack_101e0;
  string asStack_101d8 [32];
  string asStack_101b8 [39];
  undefined1 auStack_10191 [125];
  int iStack_10114;
  locale alStack_10110 [15];
  allocator<char> aStack_10101;
  string asStack_10100 [32];
  string asStack_100e0 [32];
  string asStack_100c0 [132];
  uint uStack_1003c;
  undefined1 auStack_10038 [65044];
  int in_stack_fffffffffffffddc;
  ForceField *in_stack_fffffffffffffde0;
  istream *in_stack_fffffffffffffde8;
  SectionParser *in_stack_fffffffffffffdf0;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<OpenMD::SectionParserContext> local_20;
  undefined8 local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::_List_iterator<OpenMD::SectionParserContext>::_List_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::
             list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
             begin((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                    *)in_stack_fffffffffffefca8);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::end
                   ((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                     *)in_stack_fffffffffffefca8);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                       ((_List_iterator<OpenMD::SectionParserContext> *)0x256906);
    pSVar8->isActive = false;
    std::_List_iterator<OpenMD::SectionParserContext>::operator++(&local_20);
  }
  uStack_1003c = 0;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffefcb0);
  sVar9._M_state = in_stack_fffffffffffefd20;
  sVar9._M_off = in_stack_fffffffffffefd28;
  do {
    plVar4 = (long *)std::istream::getline((char *)local_10,(long)auStack_10038);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar1) {
      bVar1 = std::
              stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x257193);
      if (!bVar1) {
        peVar10 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "SectionParserManager Error: Stack is not empty.\n\tCheck for matching begin / end lines.\n"
                );
        peVar10->isFatal = 1;
        simError();
      }
      p_Stack_10250 =
           (_List_node_base *)
           std::__cxx11::
           list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::begin
                     ((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                       *)in_stack_fffffffffffefca8);
      local_20._M_node = p_Stack_10250;
      while( true ) {
        _Stack_10258._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::end
                       ((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                         *)in_stack_fffffffffffefca8);
        bVar1 = std::operator!=(&local_20,&_Stack_10258);
        if (!bVar1) break;
        pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                           ((_List_iterator<OpenMD::SectionParserContext> *)0x257247);
        if ((pSVar8->isActive & 1U) != 0) {
          std::ios::clear((int)local_10 + (int)*(undefined8 *)(*local_10 + -0x18));
          plVar4 = local_10;
          pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                             ((_List_iterator<OpenMD::SectionParserContext> *)0x257286);
          std::istream::seekg(plVar4,(pSVar8->offset)._M_off,(pSVar8->offset)._M_state);
          std::_List_iterator<OpenMD::SectionParserContext>::operator->
                    ((_List_iterator<OpenMD::SectionParserContext> *)0x2572c0);
          std::_List_iterator<OpenMD::SectionParserContext>::operator->
                    ((_List_iterator<OpenMD::SectionParserContext> *)0x2572ed);
          SectionParser::parse
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                     in_stack_fffffffffffffddc);
          pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                             ((_List_iterator<OpenMD::SectionParserContext> *)0x257313);
          (*pSVar8->sectionParser->_vptr_SectionParser[2])(pSVar8->sectionParser,local_18);
        }
        std::_List_iterator<OpenMD::SectionParserContext>::operator++(&local_20);
      }
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x25734d);
      return;
    }
    uStack_1003c = uStack_1003c + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffefcf0,(char *)in_stack_fffffffffffefce8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffefce7,in_stack_fffffffffffefce0));
    std::locale::locale(alStack_10110);
    Utils::trimLeftCopy(in_stack_fffffffffffefcc8,(locale *)in_stack_fffffffffffefcc0);
    stripComments(in_stack_fffffffffffefcd8);
    std::__cxx11::string::~string(asStack_100e0);
    std::locale::~locale(alStack_10110);
    std::__cxx11::string::~string(asStack_10100);
    std::allocator<char>::~allocator(&aStack_10101);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      uVar5 = std::__cxx11::string::size();
      if (1 < uVar5) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)asStack_100c0);
        if (*pcVar6 == '/') {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)asStack_100c0);
          if (*pcVar6 == '/') goto LAB_00256ada;
        }
      }
      this_00 = (StringTokenizer *)auStack_10191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffefcf0,(char *)in_stack_fffffffffffefce8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffefce7,in_stack_fffffffffffefce0));
      StringTokenizer::StringTokenizer
                ((StringTokenizer *)in_stack_fffffffffffefcf0,in_stack_fffffffffffefce8,
                 (string *)CONCAT17(in_stack_fffffffffffefce7,in_stack_fffffffffffefce0));
      std::__cxx11::string::~string((string *)(auStack_10191 + 1));
      std::allocator<char>::~allocator((allocator<char> *)auStack_10191);
      iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffefcc0);
      if (iVar3 < 2) {
        iStack_10114 = 5;
      }
      else {
        StringTokenizer::nextToken_abi_cxx11_(this_00);
        bVar1 = std::operator==(&in_stack_fffffffffffefcb0->tokenString_,
                                (char *)in_stack_fffffffffffefca8);
        if (bVar1) {
          StringTokenizer::nextToken_abi_cxx11_(this_00);
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffefcb0,in_stack_fffffffffffefca8);
          p_Stack_101e8 =
               (_List_node_base *)
               std::__cxx11::
               list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
               begin((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                      *)in_stack_fffffffffffefca8);
          p_Stack_101f0 =
               (_List_node_base *)
               std::__cxx11::
               list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
               end((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                    *)in_stack_fffffffffffefca8);
          SameSectionParserFunctor::SameSectionParserFunctor
                    ((SameSectionParserFunctor *)in_stack_fffffffffffefcb0,in_stack_fffffffffffefca8
                    );
          p_Stack_101e0 =
               (_List_node_base *)
               std::
               find_if<std::_List_iterator<OpenMD::SectionParserContext>,OpenMD::SameSectionParserFunctor>
                         ((_List_node_base *)sVar9._M_off,
                          (_List_iterator<OpenMD::SectionParserContext>)sVar9._M_state,
                          (SameSectionParserFunctor *)
                          CONCAT44(in_stack_fffffffffffefd1c,in_stack_fffffffffffefd18));
          local_20 = (_List_iterator<OpenMD::SectionParserContext>)p_Stack_101e0;
          SameSectionParserFunctor::~SameSectionParserFunctor((SameSectionParserFunctor *)0x256da8);
          a_Stack_10218[0]._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
               end((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                    *)in_stack_fffffffffffefca8);
          bVar1 = std::operator==(&local_20,a_Stack_10218);
          if (bVar1) {
            uVar7 = std::__cxx11::string::c_str();
            snprintf(painCave.errMsg,2000,
                     "SectionParserManager Error: Can not find corresponding section parser for %s\n"
                     ,uVar7);
            painCave.isFatal = 1;
            simError();
          }
          else {
            pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                               ((_List_iterator<OpenMD::SectionParserContext> *)0x256e94);
            if ((pSVar8->isActive & 1U) == 0) {
              pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                                 ((_List_iterator<OpenMD::SectionParserContext> *)0x256efc);
              pSVar8->isActive = true;
              in_stack_fffffffffffefd1c = uStack_1003c;
              pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                                 ((_List_iterator<OpenMD::SectionParserContext> *)0x256f15);
              pSVar8->lineNo = in_stack_fffffffffffefd1c;
              sVar9 = (streampos)std::istream::tellg();
              sStack_10228 = sVar9;
              pSVar8 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                                 ((_List_iterator<OpenMD::SectionParserContext> *)0x256f62);
              pSVar8->offset = sStack_10228;
            }
            else {
              uVar7 = std::__cxx11::string::c_str();
              snprintf(painCave.errMsg,2000,
                       "SectionParserManager Error: Found multiple %s sections\n",uVar7);
              painCave.isFatal = 1;
              simError();
            }
          }
          std::__cxx11::string::~string(asStack_101d8);
LAB_002570d9:
          iStack_10114 = 0;
        }
        else {
          bVar1 = std::operator==(&in_stack_fffffffffffefcb0->tokenString_,
                                  (char *)in_stack_fffffffffffefca8);
          if (bVar1) {
            StringTokenizer::nextToken_abi_cxx11_(this_00);
            std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x256feb);
            _Var2 = std::operator==(in_stack_fffffffffffefcd0,in_stack_fffffffffffefcc8);
            if (_Var2) {
              std::
              stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::pop((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x257017);
            }
            else {
              std::
              stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x257051);
              in_stack_fffffffffffefce8 = (string *)std::__cxx11::string::c_str();
              uVar7 = std::__cxx11::string::c_str();
              in_stack_fffffffffffefcf0 = &painCave;
              snprintf(painCave.errMsg,2000,
                       "SectionParserManager Error: begin %s and end %s do not match at line %d\n",
                       in_stack_fffffffffffefce8,uVar7,(ulong)uStack_1003c);
              *(undefined4 *)((long)((string *)in_stack_fffffffffffefcf0->errMsg + 0x3e) + 0x10) = 1
              ;
              simError();
            }
            std::__cxx11::string::~string(asStack_10248);
            goto LAB_002570d9;
          }
          iStack_10114 = 5;
        }
        std::__cxx11::string::~string(asStack_101b8);
        if (iStack_10114 == 0) {
          iStack_10114 = 0;
        }
      }
      StringTokenizer::~StringTokenizer(in_stack_fffffffffffefcb0);
      if (iStack_10114 == 0) {
        iStack_10114 = 0;
      }
    }
    else {
LAB_00256ada:
      iStack_10114 = 5;
    }
    std::__cxx11::string::~string(asStack_100c0);
  } while( true );
}

Assistant:

void SectionParserManager::parse(std::istream& input, ForceField& ff) {
    // reset active flags
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      i->isActive = false;
    }

    const int bufferSize = 65535;
    char buffer[bufferSize];
    int lineNo = 0;
    std::stack<std::string> sectionNameStack;
    // scan through the input stream and find section names
    while (input.getline(buffer, bufferSize)) {
      ++lineNo;

      std::string line = stripComments(Utils::trimLeftCopy(buffer));
      // a line begins with "//" is a comment line
      if (line.empty() ||
          (line.size() >= 2 && line[0] == '/' && line[1] == '/')) {
        continue;
      } else {
        StringTokenizer tokenizer(line);
        if (tokenizer.countTokens() < 2) {
          continue;
        } else {
          std::string keyword = tokenizer.nextToken();

          if (keyword == "begin") {
            std::string section = tokenizer.nextToken();
            sectionNameStack.push(section);

            i = std::find_if(sectionParsers_.begin(), sectionParsers_.end(),
                             SameSectionParserFunctor(section));
            if (i == sectionParsers_.end()) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "SectionParserManager Error: Can not find corresponding "
                       "section parser for %s\n",
                       section.c_str());
              painCave.isFatal = 1;
              simError();
            } else {
              if (i->isActive) {
                snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                         "SectionParserManager Error: Found multiple %s "
                         "sections\n",
                         section.c_str());
                painCave.isFatal = 1;
                simError();
              } else {
                i->isActive = true;
                i->lineNo   = lineNo;
                i->offset   = input.tellg();
              }
            }
          } else if (keyword == "end") {
            std::string section = tokenizer.nextToken();
            if (sectionNameStack.top() == section) {
              sectionNameStack.pop();
            } else {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "SectionParserManager Error: begin %s "
                       "and end %s do not match at line %d\n",
                       sectionNameStack.top().c_str(), section.c_str(), lineNo);
              painCave.isFatal = 1;
              simError();
            }
          } else {
            continue;
          }
        }
      }
    }

    if (!sectionNameStack.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SectionParserManager Error: Stack is not empty.\n"
               "\tCheck for matching begin / end lines.\n");
      painCave.isFatal = 1;
      simError();
    }

    // invoke parser
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      if (i->isActive) {
        // C++ standard does not guarantee seekg resets EOF, in that
        // case, seekg will fail. It is always a good idea to call
        // clear() before seek
        input.clear();
        input.seekg(i->offset);
        (i->sectionParser)->parse(input, ff, i->lineNo);
        (i->sectionParser)->validateSection(ff);
      }
    }
  }